

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerResults.cpp
# Opt level: O2

void GetFrameDesc(Frame *f,DisplayBase display_base,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *results,USBStringContainer *stringDescriptors)

{
  U64 i;
  int max_bits;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string result;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  
  this = &result;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(results);
  switch(f[0x20]) {
  case (Frame)0x0:
    result._M_dataplus._M_p = (pointer)&result.field_2;
    result._M_string_length = 0;
    result.field_2._M_local_buf[0] = '\0';
    if (*(ulong *)(f + 0x10) < 4) {
      std::__cxx11::string::assign((char *)&result);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&result);
    break;
  case (Frame)0x1:
    std::__cxx11::string::string((string *)&result,"SYNC",(allocator *)&local_a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    this = &result;
    break;
  case (Frame)0x2:
    GetPIDName_abi_cxx11_(&local_a8,*(USB_PID *)(f + 0x10));
    std::operator+(&result,"PID ",&local_a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&local_a8);
    GetPIDName_abi_cxx11_(&result,*(USB_PID *)(f + 0x10));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    this = &result;
    break;
  case (Frame)0x3:
    int2str_sal_abi_cxx11_(&local_a8,*(U64 *)(f + 0x10),display_base,0xb);
    std::operator+(&result,"Frame # ",&local_a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&local_a8);
    int2str_sal_abi_cxx11_(&local_a8,*(U64 *)(f + 0x10),display_base,0xb);
    std::operator+(&result,"F # ",&local_a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::string((string *)&result,"Frame #",(allocator *)&local_a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    std::__cxx11::string::~string((string *)&result);
    int2str_sal_abi_cxx11_(&result,*(U64 *)(f + 0x10),display_base,0xb);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    this = &result;
    break;
  case (Frame)0x4:
    int2str_sal_abi_cxx11_(&local_48,*(U64 *)(f + 0x10),display_base,7);
    std::operator+(&local_88,"Address=",&local_48);
    std::operator+(&local_a8,&local_88," Endpoint=");
    int2str_sal_abi_cxx11_(&local_68,*(U64 *)(f + 0x18),display_base,5);
    std::operator+(&result,&local_a8,&local_68);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_48);
    int2str_sal_abi_cxx11_(&local_48,*(U64 *)(f + 0x10),display_base,7);
    std::operator+(&local_88,"Addr=",&local_48);
    std::operator+(&local_a8,&local_88," Endp=");
    int2str_sal_abi_cxx11_(&local_68,*(U64 *)(f + 0x18),display_base,5);
    std::operator+(&result,&local_a8,&local_68);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_48);
    int2str_sal_abi_cxx11_(&local_48,*(U64 *)(f + 0x10),display_base,7);
    std::operator+(&local_88,"A:",&local_48);
    std::operator+(&local_a8,&local_88," E:");
    int2str_sal_abi_cxx11_(&local_68,*(U64 *)(f + 0x18),display_base,5);
    std::operator+(&result,&local_a8,&local_68);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_48);
    int2str_sal_abi_cxx11_(&local_88,*(U64 *)(f + 0x10),display_base,7);
    std::operator+(&local_a8,&local_88," ");
    int2str_sal_abi_cxx11_(&local_48,*(U64 *)(f + 0x18),display_base,5);
    std::operator+(&result,&local_a8,&local_48);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_a8);
    this = &local_88;
    break;
  case (Frame)0x5:
    std::__cxx11::string::string((string *)&result,"EOP",(allocator *)&local_a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    this = &result;
    break;
  case (Frame)0x6:
    std::__cxx11::string::string((string *)&result,"Reset",(allocator *)&local_a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    this = &result;
    break;
  case (Frame)0x7:
  case (Frame)0x8:
    max_bits = 0x10;
    if (f[0x20] == (Frame)0x7) {
      max_bits = 5;
    }
    std::__cxx11::string::string((string *)&result,"CRC",(allocator *)&local_a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    std::__cxx11::string::~string((string *)&result);
    i = *(U64 *)(f + 0x10);
    if (i == *(U64 *)(f + 0x18)) {
      int2str_sal_abi_cxx11_(&local_a8,i,display_base,max_bits);
      std::operator+(&result,"CRC OK ",&local_a8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &result);
      std::__cxx11::string::~string((string *)&result);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::string((string *)&result,"CRC OK",(allocator *)&local_a8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &result);
    }
    else {
      int2str_sal_abi_cxx11_(&local_48,i,display_base,max_bits);
      std::operator+(&local_88,"CRC Bad! Rcvd: ",&local_48);
      std::operator+(&local_a8,&local_88," Calc: ");
      int2str_sal_abi_cxx11_(&local_68,*(U64 *)(f + 0x18),display_base,max_bits);
      std::operator+(&result,&local_a8,&local_68);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &result);
      std::__cxx11::string::~string((string *)&result);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_48);
      int2str_sal_abi_cxx11_(&local_a8,*(U64 *)(f + 0x10),display_base,max_bits);
      std::operator+(&result,"CRC Bad! Rcvd: ",&local_a8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &result);
      std::__cxx11::string::~string((string *)&result);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::string((string *)&result,"CRC Bad",(allocator *)&local_a8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &result);
    }
    std::__cxx11::string::~string((string *)&result);
    int2str_sal_abi_cxx11_(&result,*(U64 *)(f + 0x10),display_base,max_bits);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    this = &result;
    break;
  case (Frame)0x9:
    std::__cxx11::string::string((string *)&result,"Idle",(allocator *)&local_a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    this = &result;
    break;
  case (Frame)0xa:
    std::__cxx11::string::string((string *)&result,"Keep alive",(allocator *)&local_a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::string((string *)&result,"KA",(allocator *)&local_a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    this = &result;
    break;
  case (Frame)0xb:
    int2str_sal_abi_cxx11_(&local_a8,*(U64 *)(f + 0x10),display_base,8);
    std::operator+(&result,"Byte ",&local_a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&local_a8);
    int2str_sal_abi_cxx11_(&result,*(U64 *)(f + 0x10),display_base,8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    this = &result;
    break;
  case (Frame)0xc:
    std::__cxx11::string::string((string *)&result,"Error packet",(allocator *)&local_a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::string((string *)&result,"Error",(allocator *)&local_a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::string((string *)&result,"Err",(allocator *)&local_a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::string((string *)&result,"E",(allocator *)&local_a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&result)
    ;
    this = &result;
    break;
  case (Frame)0xd:
    GetCtrlTransFrameDesc(f,display_base,results,stringDescriptors);
    return;
  case (Frame)0xe:
    GetHIDReportDescriptorItemFrameDesc(f,display_base,results);
    return;
  default:
    goto switchD_00130934_default;
  }
  std::__cxx11::string::~string((string *)this);
switchD_00130934_default:
  return;
}

Assistant:

void GetFrameDesc( const Frame& f, DisplayBase display_base, std::vector<std::string>& results,
                   const USBAnalyzerResults::USBStringContainer& stringDescriptors )
{
    results.clear();

    if( f.mType == FT_Signal )
    {
        std::string result;
        if( f.mData1 == S_J )
            result = "J";
        else if( f.mData1 == S_K )
            result = "K";
        else if( f.mData1 == S_SE0 )
            result = "SE0";
        else if( f.mData1 == S_SE1 )
            result = "SE1";

        results.push_back( result );
    }
    else if( f.mType == FT_EOP )
    {
        results.push_back( "EOP" );
    }
    else if( f.mType == FT_Reset )
    {
        results.push_back( "Reset" );
    }
    else if( f.mType == FT_Idle )
    {
        results.push_back( "Idle" );
    }
    else if( f.mType == FT_SYNC )
    {
        results.push_back( "SYNC" );
    }
    else if( f.mType == FT_PID )
    {
        results.push_back( "PID " + GetPIDName( USB_PID( f.mData1 ) ) );
        results.push_back( GetPIDName( USB_PID( f.mData1 ) ) );
    }
    else if( f.mType == FT_FrameNum )
    {
        results.push_back( "Frame # " + int2str_sal( f.mData1, display_base, 11 ) );
        results.push_back( "F # " + int2str_sal( f.mData1, display_base, 11 ) );
        results.push_back( "Frame #" );
        results.push_back( int2str_sal( f.mData1, display_base, 11 ) );
    }
    else if( f.mType == FT_AddrEndp )
    {
        results.push_back( "Address=" + int2str_sal( f.mData1, display_base, 7 ) +
                           " Endpoint=" + int2str_sal( f.mData2, display_base, 5 ) );
        results.push_back( "Addr=" + int2str_sal( f.mData1, display_base, 7 ) + " Endp=" + int2str_sal( f.mData2, display_base, 5 ) );
        results.push_back( "A:" + int2str_sal( f.mData1, display_base, 7 ) + " E:" + int2str_sal( f.mData2, display_base, 5 ) );
        results.push_back( int2str_sal( f.mData1, display_base, 7 ) + " " + int2str_sal( f.mData2, display_base, 5 ) );
    }
    else if( f.mType == FT_Byte )
    {
        results.push_back( "Byte " + int2str_sal( f.mData1, display_base, 8 ) );
        results.push_back( int2str_sal( f.mData1, display_base, 8 ) );
    }
    else if( f.mType == FT_KeepAlive )
    {
        results.push_back( "Keep alive" );
        results.push_back( "KA" );
    }
    else if( f.mType == FT_CRC5 || f.mType == FT_CRC16 )
    {
        const int num_bits = f.mType == FT_CRC5 ? 5 : 16;
        results.push_back( "CRC" );
        if( f.mData1 == f.mData2 )
        {
            results.push_back( "CRC OK " + int2str_sal( f.mData1, display_base, num_bits ) );
            results.push_back( "CRC OK" );
        }
        else
        {
            results.push_back( "CRC Bad! Rcvd: " + int2str_sal( f.mData1, display_base, num_bits ) +
                               " Calc: " + int2str_sal( f.mData2, display_base, num_bits ) );
            results.push_back( "CRC Bad! Rcvd: " + int2str_sal( f.mData1, display_base, num_bits ) );
            results.push_back( "CRC Bad" );
        }

        results.push_back( int2str_sal( f.mData1, display_base, num_bits ) );
    }
    else if( f.mType == FT_Error )
    {
        results.push_back( "Error packet" );
        results.push_back( "Error" );
        results.push_back( "Err" );
        results.push_back( "E" );
    }
    else if( f.mType == FT_ControlTransferField )
    {
        GetCtrlTransFrameDesc( f, display_base, results, stringDescriptors );
    }
    else if( f.mType == FT_HIDReportDescriptorItem )
    {
        GetHIDReportDescriptorItemFrameDesc( f, display_base, results );
    }
}